

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O0

int int_x509_param_set_hosts(X509_VERIFY_PARAM *param,int mode,char *name,size_t namelen)

{
  void *pvVar1;
  char *p;
  stack_st_OPENSSL_STRING *psVar2;
  size_t sVar3;
  char *copy;
  size_t namelen_local;
  char *name_local;
  int mode_local;
  X509_VERIFY_PARAM *param_local;
  
  if ((name == (char *)0x0) || (namelen == 0)) {
    param_local._4_4_ = 0;
  }
  else {
    if ((name != (char *)0x0) && (pvVar1 = OPENSSL_memchr(name,0,namelen), pvVar1 != (void *)0x0)) {
      return 0;
    }
    if ((mode == 0) && (param->hosts != (stack_st_OPENSSL_STRING *)0x0)) {
      sk_OPENSSL_STRING_pop_free(param->hosts,str_free);
      param->hosts = (stack_st_OPENSSL_STRING *)0x0;
    }
    p = OPENSSL_strndup(name,namelen);
    if (p == (char *)0x0) {
      param_local._4_4_ = 0;
    }
    else {
      if (param->hosts == (stack_st_OPENSSL_STRING *)0x0) {
        psVar2 = sk_OPENSSL_STRING_new_null();
        param->hosts = psVar2;
        if (psVar2 == (stack_st_OPENSSL_STRING *)0x0) {
          OPENSSL_free(p);
          return 0;
        }
      }
      sVar3 = sk_OPENSSL_STRING_push(param->hosts,p);
      if (sVar3 == 0) {
        OPENSSL_free(p);
        sVar3 = sk_OPENSSL_STRING_num(param->hosts);
        if (sVar3 == 0) {
          sk_OPENSSL_STRING_free(param->hosts);
          param->hosts = (stack_st_OPENSSL_STRING *)0x0;
        }
        param_local._4_4_ = 0;
      }
      else {
        param_local._4_4_ = 1;
      }
    }
  }
  return param_local._4_4_;
}

Assistant:

static int int_x509_param_set_hosts(X509_VERIFY_PARAM *param, int mode,
                                    const char *name, size_t namelen) {
  char *copy;

  if (name == NULL || namelen == 0) {
    // Unlike OpenSSL, we reject trying to set or add an empty name.
    return 0;
  }

  // Refuse names with embedded NUL bytes.
  // XXX: Do we need to push an error onto the error stack?
  if (name && OPENSSL_memchr(name, '\0', namelen)) {
    return 0;
  }

  if (mode == SET_HOST && param->hosts) {
    sk_OPENSSL_STRING_pop_free(param->hosts, str_free);
    param->hosts = NULL;
  }

  copy = OPENSSL_strndup(name, namelen);
  if (copy == NULL) {
    return 0;
  }

  if (param->hosts == NULL &&
      (param->hosts = sk_OPENSSL_STRING_new_null()) == NULL) {
    OPENSSL_free(copy);
    return 0;
  }

  if (!sk_OPENSSL_STRING_push(param->hosts, copy)) {
    OPENSSL_free(copy);
    if (sk_OPENSSL_STRING_num(param->hosts) == 0) {
      sk_OPENSSL_STRING_free(param->hosts);
      param->hosts = NULL;
    }
    return 0;
  }

  return 1;
}